

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  size_t sVar3;
  pointer pbVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  
  this->m_suffix = false;
  pCVar2 = this->m_column;
  sVar11 = this->m_stringIndex;
  sVar3 = this->m_pos;
  if ((sVar3 != 0 || sVar11 != 0) || (sVar8 = pCVar2->m_initialIndent, sVar8 == 0xffffffffffffffff))
  {
    sVar8 = pCVar2->m_indent;
  }
  sVar12 = pCVar2->m_width;
  this->m_end = sVar3;
  pbVar4 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = *(long *)&pbVar4[sVar11]._M_dataplus;
  sVar9 = sVar3;
  if (*(char *)(lVar7 + sVar3) == '\n') {
    sVar9 = sVar3 + 1;
    this->m_end = sVar9;
  }
  sVar12 = sVar12 - sVar8;
  uVar5 = *(size_type *)((long)(pbVar4 + sVar11) + 8);
  uVar10 = sVar9;
  if (sVar9 < uVar5) {
    do {
      uVar10 = sVar9;
      if (*(char *)(lVar7 + sVar9) == '\n') break;
      sVar9 = sVar9 + 1;
      this->m_end = sVar9;
      uVar10 = uVar5;
    } while (uVar5 != sVar9);
  }
  sVar11 = sVar12;
  if (uVar10 < sVar12 + sVar3) {
    sVar11 = uVar10 - sVar3;
    goto LAB_00150aec;
  }
  for (; sVar11 != 0; sVar11 = sVar11 - 1) {
    bVar6 = isBoundary(this,this->m_pos + sVar11);
    if (bVar6) goto LAB_00150b00;
  }
  goto LAB_00150ae2;
  while (sVar11 = sVar11 - 1, sVar11 != 0) {
LAB_00150b00:
    cVar1 = *(char *)((sVar11 - 1) +
                     *(long *)&(this->m_column->m_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                               _M_dataplus + this->m_pos);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      calcLength();
    }
    lVar7 = ::std::__cxx11::string::find(-0x50,(ulong)(uint)(int)cVar1);
    if (lVar7 == -1) goto LAB_00150aec;
  }
LAB_00150ae2:
  this->m_suffix = true;
  sVar11 = sVar12 - 1;
LAB_00150aec:
  this->m_len = sVar11;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}